

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[25],kj::StringPtr,char_const(&)[20],unsigned_int&,char_const(&)[30]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [25],StringPtr *params_1,
          char (*params_2) [20],uint *params_3,char (*params_4) [30])

{
  ArrayPtr<const_char> *in_stack_ffffffffffffff68;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  CappedArray<char,_14UL> local_48;
  
  local_58 = toCharSequence<char_const(&)[25]>((char (*) [25])this);
  local_68.ptr = *(char **)*params;
  local_68.size_ = *(long *)(*params + 8) - 1;
  local_78 = toCharSequence<char_const(&)[20]>((char (*) [20])params_1);
  toCharSequence<unsigned_int&>(&local_48,(kj *)params_2,(uint *)local_78.size_);
  local_88 = toCharSequence<char_const(&)[30]>((char (*) [30])params_3);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_58,&local_68,&local_78,
             (ArrayPtr<const_char> *)&local_48,(CappedArray<char,_14UL> *)&local_88,
             in_stack_ffffffffffffff68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}